

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

void rw::ps2::sendVIF(uint32 w)

{
  uint uVar1;
  uint32 uVar2;
  uint uVar3;
  uint32 num;
  uint32 imm;
  uint32 w_local;
  
  uVar1 = w >> 0x10 & 0xff;
  switch(sendVIF::state) {
  case VST_cmd:
    sendVIF::code = w;
    if ((w & 0x60000000) == 0x60000000) {
      printf("\t%08X VIF_UNPACK\n",(ulong)w);
      printf("\t...skipping...\n");
      sendVIF::state = VST_unpack;
      uVar2 = unpackSize(sendVIF::code);
      sendVIF::n = uVar2 * uVar1 + 3 >> 2;
    }
    else {
      uVar3 = w & 0x7f000000;
      if (uVar3 == 0) {
        printf("\t%08X VIF_NOP\n",(ulong)w);
      }
      else if (uVar3 == 0x1000000) {
        printf("\t%08X VIF_STCYCL\n",(ulong)w);
      }
      else if (uVar3 == 0x2000000) {
        printf("\t%08X VIF_OFFSET\n",(ulong)w);
      }
      else if (uVar3 == 0x3000000) {
        printf("\t%08X VIF_BASE\n",(ulong)w);
      }
      else if (uVar3 == 0x4000000) {
        printf("\t%08X VIF_ITOP\n",(ulong)w);
      }
      else if (uVar3 == 0x5000000) {
        printf("\t%08X VIF_STMOD\n",(ulong)w);
      }
      else if (uVar3 == 0x6000000) {
        printf("\t%08X VIF_MSKPATH3\n",(ulong)w);
      }
      else if (uVar3 == 0x7000000) {
        printf("\t%08X VIF_MARK\n",(ulong)w);
      }
      else if (uVar3 == 0x10000000) {
        printf("\t%08X VIF_FLUSHE\n",(ulong)w);
      }
      else if (uVar3 == 0x11000000) {
        printf("\t%08X VIF_FLUSH\n",(ulong)w);
      }
      else if (uVar3 == 0x13000000) {
        printf("\t%08X VIF_FLUSHA\n",(ulong)w);
      }
      else if (uVar3 == 0x14000000) {
        printf("\t%08X VIF_MSCAL\n",(ulong)w);
      }
      else if (uVar3 == 0x15000000) {
        printf("\t%08X VIF_MSCALF\n",(ulong)w);
      }
      else if (uVar3 == 0x17000000) {
        printf("\t%08X VIF_MSCNT\n",(ulong)w);
      }
      else if (uVar3 == 0x20000000) {
        printf("\t%08X VIF_STMASK\n",(ulong)w);
        printf("\t...skipping...\n");
        sendVIF::state = VST_stmask;
        sendVIF::n = 1;
      }
      else if (uVar3 == 0x30000000) {
        printf("\t%08X VIF_STROW\n",(ulong)w);
        printf("\t...skipping...\n");
        sendVIF::state = VST_strow;
        sendVIF::n = 4;
      }
      else if (uVar3 == 0x31000000) {
        printf("\t%08X VIF_STCOL\n",(ulong)w);
        printf("\t...skipping...\n");
        sendVIF::state = VST_stcol;
        sendVIF::n = 4;
      }
      else if (uVar3 == 0x4a000000) {
        printf("\t%08X VIF_MPG\n",(ulong)w);
        sendVIF::state = VST_mpg;
        sendVIF::n = uVar1 << 1;
      }
      else if (uVar3 == 0x50000000) {
        printf("\t%08X VIF_DIRECT\n",(ulong)w);
        printf("\t...skipping...\n");
        sendVIF::state = VST_direct;
        sendVIF::n = (w & 0xffff) << 2;
      }
      else if (uVar3 == 0x51000000) {
        printf("\t%08X VIF_DIRECTHL\n",(ulong)w);
        printf("\t...skipping...\n");
        sendVIF::state = VST_direct;
        sendVIF::n = (w & 0xffff) << 2;
      }
      else {
        printf("\tUnknown VIFcode %08X\n",(ulong)w);
      }
    }
    break;
  case VST_stmask:
    sendVIF::n = sendVIF::n - 1;
    break;
  case VST_strow:
    sendVIF::n = sendVIF::n - 1;
    break;
  case VST_stcol:
    sendVIF::n = sendVIF::n - 1;
    break;
  case VST_mpg:
    sendVIF::n = sendVIF::n - 1;
    break;
  case VST_direct:
    sendVIF::n = sendVIF::n - 1;
    break;
  case VST_unpack:
    sendVIF::n = sendVIF::n - 1;
  }
  if (sendVIF::n == 0) {
    sendVIF::state = VST_cmd;
  }
  return;
}

Assistant:

static void
sendVIF(uint32 w)
{
	enum VIFstate {
		VST_cmd,
		VST_stmask,
		VST_strow,
		VST_stcol,
		VST_mpg,
		VST_direct,
		VST_unpack
	};
//	static uint32 buf[256 * 16];	// maximum unpack size
	static VIFstate state = VST_cmd;
	static uint32 n;
	static uint32 code;
	uint32 imm, num;

	imm = w & 0xFFFF;
	num = (w>>16) & 0xFF;
	switch(state){
	case VST_cmd:
		code = w;
		if((code & 0x60000000) == VIF_UNPACK){
			printf("\t%08X VIF_UNPACK\n", code);
			printf("\t...skipping...\n");
			state = VST_unpack;
			n = (unpackSize(code)*num + 3) >> 2;
		}else switch(code & 0x7F000000){
		case VIF_NOP:
			printf("\t%08X VIF_NOP\n", code);
			break;
		case VIF_STCYCL:
			printf("\t%08X VIF_STCYCL\n", code);
			break;
		case VIF_OFFSET:
			printf("\t%08X VIF_OFFSET\n", code);
			break;
		case VIF_BASE:
			printf("\t%08X VIF_BASE\n", code);
			break;
		case VIF_ITOP:
			printf("\t%08X VIF_ITOP\n", code);
			break;
		case VIF_STMOD:
			printf("\t%08X VIF_STMOD\n", code);
			break;
		case VIF_MSKPATH3:
			printf("\t%08X VIF_MSKPATH3\n", code);
			break;
		case VIF_MARK:
			printf("\t%08X VIF_MARK\n", code);
			break;
		case VIF_FLUSHE:
			printf("\t%08X VIF_FLUSHE\n", code);
			break;
		case VIF_FLUSH:
			printf("\t%08X VIF_FLUSH\n", code);
			break;
		case VIF_FLUSHA:
			printf("\t%08X VIF_FLUSHA\n", code);
			break;
		case VIF_MSCAL:
			printf("\t%08X VIF_MSCAL\n", code);
			break;
		case VIF_MSCALF:
			printf("\t%08X VIF_MSCALF\n", code);
			break;
		case VIF_MSCNT:
			printf("\t%08X VIF_MSCNT\n", code);
			break;
		case VIF_STMASK:
			printf("\t%08X VIF_STMASK\n", code);
			printf("\t...skipping...\n");
			state = VST_stmask;
			n = 1;
			break;
		case VIF_STROW:
			printf("\t%08X VIF_STROW\n", code);
			printf("\t...skipping...\n");
			state = VST_strow;
			n = 4;
			break;
		case VIF_STCOL:
			printf("\t%08X VIF_STCOL\n", code);
			printf("\t...skipping...\n");
			state = VST_stcol;
			n = 4;
			break;
		case VIF_MPG:
			printf("\t%08X VIF_MPG\n", code);
			state = VST_mpg;
			n = num*2;
			break;
		case VIF_DIRECT:
			printf("\t%08X VIF_DIRECT\n", code);
			printf("\t...skipping...\n");
			state = VST_direct;
			n = imm*4;
			break;
		case VIF_DIRECTHL:
			printf("\t%08X VIF_DIRECTHL\n", code);
			printf("\t...skipping...\n");
			state = VST_direct;
			n = imm*4;
			break;
		default:
			printf("\tUnknown VIFcode %08X\n", code);
		}
		break;
	/* TODO: actually do something here */
	case VST_stmask:
		n--;
		break;
	case VST_strow:
		n--;
		break;
	case VST_stcol:
		n--;
		break;
	case VST_mpg:
		n--;
		break;
	case VST_direct:
		n--;
		break;
	case VST_unpack:
		n--;
		break;
	}
	if(n == 0)
		state = VST_cmd;
}